

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O0

void __thiscall DGLTextureGLOptions::Drawer(DGLTextureGLOptions *this)

{
  char *str;
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int y;
  int x;
  char *text;
  size_t i;
  DGLTextureGLOptions *this_local;
  
  DOptionMenu::Drawer(&this->super_DOptionMenu);
  iVar3 = FIntCVar::operator_cast_to_int(&gl_texture_hqresize_textures);
  if (((0 < iVar3) ||
      (iVar3 = FIntCVar::operator_cast_to_int(&gl_texture_hqresize_sprites), 0 < iVar3)) &&
     (bVar2 = FBoolCVar::operator_cast_to_bool(&gl_precache), !bVar2)) {
    for (text = (char *)0x0; text < (char *)0x3; text = text + 1) {
      str = Drawer::HINT_TEXT[(long)text];
      iVar4 = DCanvas::GetWidth((DCanvas *)screen);
      iVar5 = FFont::StringWidth(SmallFont,str);
      iVar5 = iVar5 * CleanXfac_1;
      iVar3 = ((this->super_DOptionMenu).mDesc)->mPosition;
      iVar6 = FFont::GetHeight(BigFont);
      iVar1 = OptionSettings.mLinespacing;
      uVar7 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                        (&(((this->super_DOptionMenu).mDesc)->mItems).
                          super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,OptionSettings.mFontColor,(iVar4 - iVar5) / 2,
                        ((iVar6 - iVar3) + iVar1 * (uVar7 + 2 + (int)text)) * CleanYfac_1,str,
                        0x40001394,1,0);
    }
  }
  return;
}

Assistant:

virtual void Drawer()
	{
		Super::Drawer();

		EXTERN_CVAR(Int, gl_texture_hqresize_textures);
		EXTERN_CVAR(Int, gl_texture_hqresize_sprites);
		EXTERN_CVAR(Bool, gl_precache);

		if ((   gl_texture_hqresize_textures > 0
			 || gl_texture_hqresize_sprites  > 0)
				&& !gl_precache)
		{
			static const char* const HINT_TEXT[] =
			{
				"Consider to turn on",
				"'Precache GL textures' option",
				"to avoid stuttering during play"
			};

			for (size_t i = 0; i < sizeof HINT_TEXT / sizeof HINT_TEXT[0]; ++i)
			{
				const char* const text = HINT_TEXT[i];

				const int x = (screen->GetWidth() - SmallFont->StringWidth(text) * CleanXfac_1) / 2;
				const int y = ((-mDesc->mPosition + BigFont->GetHeight())
					+ OptionSettings.mLinespacing * (mDesc->mItems.Size() + 2 + i)) * CleanYfac_1;

				screen->DrawText(SmallFont, OptionSettings.mFontColor,
					x, y, text, DTA_CleanNoMove_1, true, TAG_DONE);
			}
		}
	}